

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

void __thiscall
Query::Query(Query *this,QueryType *type,vector<Query,_std::allocator<Query>_> *queries)

{
  undefined4 *in_RSI;
  vector<Query,_std::allocator<Query>_> *in_RDI;
  pointer *ppQVar1;
  
  *(undefined4 *)
   &(in_RDI->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
    _M_start = *in_RSI;
  ppQVar1 = &(in_RDI->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  Catch::clara::std::vector<QToken,_std::allocator<QToken>_>::vector
            ((vector<QToken,_std::allocator<QToken>_> *)0x20a8b3);
  PrimitiveQuery::PrimitiveQuery
            ((PrimitiveQuery *)
             &in_RDI[1].super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
              super__Vector_impl_data._M_finish,GRAM3,0);
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = 0;
  Catch::clara::std::vector<Query,_std::allocator<Query>_>::vector
            (in_RDI,(vector<Query,_std::allocator<Query>_> *)ppQVar1);
  return;
}

Assistant:

Query::Query(const QueryType &type, std::vector<Query> &&queries)
    : type(type), count(0), queries(std::move(queries)) {}